

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int ReadImageInfo(VP8LBitReader *br,int *width,int *height,int *has_alpha)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = VP8LReadBits(br,8);
  uVar2 = 0;
  if (uVar1 == 0x2f) {
    uVar1 = VP8LReadBits(br,0xe);
    *width = uVar1 + 1;
    uVar1 = VP8LReadBits(br,0xe);
    *height = uVar1 + 1;
    uVar1 = VP8LReadBits(br,1);
    *has_alpha = uVar1;
    uVar1 = VP8LReadBits(br,3);
    if (uVar1 == 0) {
      uVar2 = (uint)(br->eos_ == 0);
    }
  }
  return uVar2;
}

Assistant:

static int ReadImageInfo(VP8LBitReader* const br,
                         int* const width, int* const height,
                         int* const has_alpha) {
  if (VP8LReadBits(br, 8) != VP8L_MAGIC_BYTE) return 0;
  *width = VP8LReadBits(br, VP8L_IMAGE_SIZE_BITS) + 1;
  *height = VP8LReadBits(br, VP8L_IMAGE_SIZE_BITS) + 1;
  *has_alpha = VP8LReadBits(br, 1);
  if (VP8LReadBits(br, VP8L_VERSION_BITS) != 0) return 0;
  return !br->eos_;
}